

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O3

void Vta_ObjPreds(Vta_Man_t *p,Vta_Obj_t *pThis,Gia_Obj_t *pObj,Vta_Obj_t **ppThis0,
                 Vta_Obj_t **ppThis1)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  Vta_Obj_t *pVVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  
  *ppThis0 = (Vta_Obj_t *)0x0;
  *ppThis1 = (Vta_Obj_t *)0x0;
  pGVar3 = p->pGia;
  uVar4 = *(ulong *)pObj;
  uVar9 = (uint)uVar4;
  if ((uVar9 & 0x9fffffff) == 0x9fffffff) {
    uVar9 = (uint)(uVar4 >> 0x20);
    if ((int)(uVar9 & 0x1fffffff) < pGVar3->vCis->nSize - pGVar3->nRegs) {
      __assert_fail("!Gia_ObjIsPi(p->pGia, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x1bc,
                    "void Vta_ObjPreds(Vta_Man_t *, Vta_Obj_t *, Gia_Obj_t *, Vta_Obj_t **, Vta_Obj_t **)"
                   );
    }
    if (((~uVar4 & 0x1fffffff1fffffff) != 0) && (pThis->iFrame != 0)) {
      uVar9 = uVar9 & 0x1fffffff;
      iVar10 = pGVar3->vCis->nSize;
      if (((int)uVar9 < iVar10 - pGVar3->nRegs) || (iVar8 = pThis->iFrame, iVar8 < 1)) {
LAB_00623a98:
        __assert_fail("Gia_ObjIsRo(p->pGia, pObj) && pThis->iFrame > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x1c6,
                      "void Vta_ObjPreds(Vta_Man_t *, Vta_Obj_t *, Gia_Obj_t *, Vta_Obj_t **, Vta_Obj_t **)"
                     );
      }
      iVar1 = pGVar3->vCos->nSize;
      uVar9 = (iVar1 - iVar10) + uVar9;
      if (((int)uVar9 < 0) || (iVar1 <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar10 = pGVar3->vCos->pArray[uVar9];
      if (((long)iVar10 < 0) || (pGVar3->nObjs <= iVar10)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      iVar10 = iVar10 - (*(uint *)(pGVar3->pObjs + iVar10) & 0x1fffffff);
      uVar9 = p->pBins[(int)((uint)((iVar10 + iVar8) * (iVar10 + iVar8 + -1)) % (uint)p->nBins)];
      if (((int)uVar9 < 0) || (iVar1 = p->nObjs, iVar1 <= (int)uVar9)) {
LAB_00623a5a:
        __assert_fail("i >= 0 && i < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x68,"Vta_Obj_t *Vta_ManObj(Vta_Man_t *, int)");
      }
      if (uVar9 != 0) {
        pVVar6 = p->pObjs;
        do {
          if ((pVVar6[uVar9].iObj == iVar10) && (pVVar6[uVar9].iFrame == iVar8 + -1)) {
            if (iVar1 <= (int)uVar9) goto LAB_00623a5a;
            pVVar6 = pVVar6 + uVar9;
            goto LAB_00623a4b;
          }
          uVar9 = pVVar6[uVar9].iNext;
          if (((int)uVar9 < 0) || (iVar1 <= (int)uVar9)) goto LAB_00623a5a;
        } while (uVar9 != 0);
        if (iVar1 < 1) goto LAB_00623a5a;
      }
      pVVar6 = (Vta_Obj_t *)0x0;
LAB_00623a4b:
      *ppThis0 = pVVar6;
    }
  }
  else if ((~uVar4 & 0x1fffffff1fffffff) != 0) {
    if (((int)uVar9 < 0) || ((uVar9 & 0x1fffffff) == 0x1fffffff)) goto LAB_00623a98;
    pGVar5 = pGVar3->pObjs;
    if ((pObj < pGVar5) || (pGVar5 + pGVar3->nObjs <= pObj)) {
LAB_00623a79:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar8 = (int)((ulong)((long)pObj - (long)pGVar5) >> 2) * -0x55555555 - (uVar9 & 0x1fffffff);
    iVar10 = pThis->iFrame;
    uVar9 = p->nBins;
    uVar7 = p->pBins[(int)((uint)((iVar10 + iVar8 + 1) * (iVar10 + iVar8)) % uVar9)];
    if ((-1 < (int)uVar7) && (uVar2 = p->nObjs, (int)uVar7 < (int)uVar2)) {
      if (uVar7 != 0) {
        pVVar6 = p->pObjs;
        do {
          if ((pVVar6[uVar7].iObj == iVar8) && (pVVar6[uVar7].iFrame == iVar10)) {
            if ((int)uVar2 <= (int)uVar7) goto LAB_00623a5a;
            pVVar6 = pVVar6 + uVar7;
            goto LAB_0062398c;
          }
          uVar7 = pVVar6[uVar7].iNext;
          if (((int)uVar7 < 0) || ((int)uVar2 <= (int)uVar7)) goto LAB_00623a5a;
        } while (uVar7 != 0);
        if ((int)uVar2 < 1) goto LAB_00623a5a;
      }
      pVVar6 = (Vta_Obj_t *)0x0;
LAB_0062398c:
      *ppThis0 = pVVar6;
      pGVar5 = p->pGia->pObjs;
      if ((pObj < pGVar5) || (pGVar5 + p->pGia->nObjs <= pObj)) goto LAB_00623a79;
      iVar8 = (int)((ulong)((long)pObj - (long)pGVar5) >> 2) * -0x55555555 -
              (*(uint *)&pObj->field_0x4 & 0x1fffffff);
      uVar9 = p->pBins[(int)((uint)((iVar8 + iVar10 + 1) * (iVar8 + iVar10)) % uVar9)];
      if ((-1 < (int)uVar9) && (uVar9 < uVar2)) {
        if (uVar9 != 0) {
          pVVar6 = p->pObjs;
          do {
            if ((pVVar6[uVar9].iObj == iVar8) && (pVVar6[uVar9].iFrame == iVar10)) {
              if ((int)uVar2 <= (int)uVar9) goto LAB_00623a5a;
              pVVar6 = pVVar6 + uVar9;
              goto LAB_00623a3a;
            }
            uVar9 = pVVar6[uVar9].iNext;
            if (((int)uVar9 < 0) || ((int)uVar2 <= (int)uVar9)) goto LAB_00623a5a;
          } while (uVar9 != 0);
          if ((int)uVar2 < 1) goto LAB_00623a5a;
        }
        pVVar6 = (Vta_Obj_t *)0x0;
LAB_00623a3a:
        *ppThis1 = pVVar6;
        return;
      }
    }
    goto LAB_00623a5a;
  }
  return;
}

Assistant:

static inline void Vta_ObjPreds( Vta_Man_t * p, Vta_Obj_t * pThis, Gia_Obj_t * pObj, Vta_Obj_t ** ppThis0, Vta_Obj_t ** ppThis1 )
{
    *ppThis0 = NULL;
    *ppThis1 = NULL;
//    if ( !pThis->fAdded )
//        return;
    assert( !Gia_ObjIsPi(p->pGia, pObj) );
    if ( Gia_ObjIsConst0(pObj) || (Gia_ObjIsCi(pObj) && pThis->iFrame == 0) )
        return;
    if ( Gia_ObjIsAnd(pObj) )
    {
        *ppThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame );
        *ppThis1 = Vga_ManFind( p, Gia_ObjFaninId1p(p->pGia, pObj), pThis->iFrame );
//        assert( *ppThis0 && *ppThis1 );
        return;
    }
    assert( Gia_ObjIsRo(p->pGia, pObj) && pThis->iFrame > 0 );
    pObj = Gia_ObjRoToRi( p->pGia, pObj );
    *ppThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame-1 );
//    assert( *ppThis0 );
}